

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-tree.c
# Opt level: O0

void ndn_nametree_init(void *memory,ndn_table_id_t capacity)

{
  int local_24;
  int i;
  ndn_nametree_t *nametree;
  ndn_table_id_t capacity_local;
  void *memory_local;
  
  for (local_24 = 0; local_24 < (int)(uint)capacity; local_24 = local_24 + 1) {
    *(undefined2 *)((long)memory + (long)local_24 * 0x2e + 0x2c) = 0xffff;
    *(undefined2 *)((long)memory + (long)local_24 * 0x2e + 0x2a) = 0xffff;
    *(undefined2 *)((long)memory + (long)local_24 * 0x2e + 0x26) = 0xffff;
    *(short *)((long)memory + (long)local_24 * 0x2e + 0x28) = (short)local_24 + 1;
  }
  *(undefined2 *)((long)memory + (long)(int)(capacity - 1) * 0x2e + 0x28) = 0xffff;
  return;
}

Assistant:

void
ndn_nametree_init(void* memory, ndn_table_id_t capacity)
{
  ndn_nametree_t *nametree = (ndn_nametree_t*)memory;
  //all free entries are linked as right_bro of (*nametree)[0], the root of the tree.
  for (int i = 0; i < capacity; ++i) {
    (*nametree)[i].left_child = (*nametree)[i].pit_id = (*nametree)[i].fib_id = NDN_INVALID_ID;
    (*nametree)[i].right_bro = i + 1;
  }
  (*nametree)[capacity - 1].right_bro = NDN_INVALID_ID;
}